

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void gen_memset(c2m_ctx_t c2m_ctx,MIR_disp_t disp,MIR_reg_t base,mir_size_t len)

{
  gen_ctx_conflict *pgVar1;
  MIR_context_t ctx_00;
  MIR_op_t op1;
  MIR_op_t op2;
  MIR_op_t op3;
  MIR_type_t MVar2;
  MIR_item_t_conflict pMVar3;
  MIR_insn_t_conflict insn;
  MIR_op_t local_3b8;
  MIR_op_t local_388;
  MIR_op_t local_358;
  MIR_op_t local_328;
  op_t local_2f8;
  MIR_op_t local_2b8;
  op_t local_288;
  MIR_op_t local_248;
  MIR_op_t local_218;
  MIR_module_t local_1e0;
  MIR_module_t module;
  MIR_op_t args [6];
  MIR_op_t treg_op;
  MIR_var_t vars [3];
  MIR_type_t ret_type;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  mir_size_t len_local;
  MIR_reg_t base_local;
  MIR_disp_t disp_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  ctx_00 = c2m_ctx->ctx;
  if (pgVar1->memset_item == (MIR_item_t)0x0) {
    vars[2].size._4_4_ = get_int_mir_type(8);
    vars[0]._0_8_ = (long)"r r s" + 4;
    treg_op.u.mem.disp._0_4_ = get_int_mir_type(8);
    vars[1]._0_8_ = (long)"wrong hexadecimal char %c" + 0x18;
    vars[0].size._0_4_ = get_int_mir_type(4);
    vars[2]._0_8_ = (long)"\\n" + 1;
    vars[1].size._0_4_ = get_int_mir_type(8);
    local_1e0 = pgVar1->curr_func->module;
    pMVar3 = MIR_new_proto_arr(ctx_00,"memset_p",1,(MIR_type_t *)((long)&vars[2].size + 4),3,
                               (MIR_var_t *)((long)&treg_op.u + 0x18));
    pgVar1->memset_proto = pMVar3;
    pMVar3 = MIR_new_import(ctx_00,"memset");
    pgVar1->memset_item = pMVar3;
    move_item_to_module_start(local_1e0,pgVar1->memset_proto);
    move_item_to_module_start(local_1e0,pgVar1->memset_item);
  }
  MIR_new_ref_op(&local_218,ctx_00,pgVar1->memset_proto);
  memcpy(&module,&local_218,0x30);
  MIR_new_ref_op(&local_248,ctx_00,pgVar1->memset_item);
  memcpy((void *)((long)&args[0].u + 0x18),&local_248,0x30);
  MVar2 = get_int_mir_type(8);
  get_new_temp(&local_288,c2m_ctx,MVar2);
  memcpy((void *)((long)&args[1].u + 0x18),&local_288.mir_op,0x30);
  if (disp == 0) {
    MIR_new_reg_op(&local_2b8,ctx_00,base);
    memcpy((void *)((long)&args[5].u + 0x18),&local_2b8,0x30);
  }
  else {
    MVar2 = get_int_mir_type(8);
    get_new_temp(&local_2f8,c2m_ctx,MVar2);
    memcpy((void *)((long)&args[5].u + 0x18),&local_2f8.mir_op,0x30);
    MIR_new_reg_op(&local_328,ctx_00,base);
    MIR_new_int_op(&local_358,ctx_00,disp);
    op1._8_8_ = treg_op.data;
    op1.data = (void *)args[5].u._24_8_;
    op1.u.i = treg_op._8_8_;
    op1.u._8_8_ = treg_op.u.i;
    op1.u._16_8_ = treg_op.u.str.s;
    op1.u.mem.disp = treg_op.u._16_8_;
    op2._8_8_ = local_328._8_8_;
    op2.data = local_328.data;
    op2.u.i = local_328.u.i;
    op2.u.str.s = local_328.u.str.s;
    op2.u._16_8_ = local_328.u._16_8_;
    op2.u.mem.disp = local_328.u.mem.disp;
    op3._8_8_ = local_358._8_8_;
    op3.data = local_358.data;
    op3.u.i = local_358.u.i;
    op3.u.str.s = local_358.u.str.s;
    op3.u._16_8_ = local_358.u._16_8_;
    op3.u.mem.disp = local_358.u.mem.disp;
    emit3(c2m_ctx,MIR_ADD,op1,op2,op3);
  }
  memcpy((void *)((long)&args[2].u + 0x18),(void *)((long)&args[5].u + 0x18),0x30);
  MIR_new_int_op(&local_388,ctx_00,0);
  memcpy((void *)((long)&args[3].u + 0x18),&local_388,0x30);
  MIR_new_uint_op(&local_3b8,ctx_00,len);
  memcpy((void *)((long)&args[4].u + 0x18),&local_3b8,0x30);
  insn = MIR_new_insn_arr(ctx_00,MIR_CALL,6,(MIR_op_t *)&module);
  emit_insn(c2m_ctx,insn);
  return;
}

Assistant:

static void gen_memset (c2m_ctx_t c2m_ctx, MIR_disp_t disp, MIR_reg_t base, mir_size_t len) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t ret_type;
  MIR_var_t vars[3];
  MIR_op_t treg_op, args[6];
  MIR_module_t module;

  if (memset_item == NULL) {
    ret_type = get_int_mir_type (sizeof (mir_size_t));
    vars[0].name = "s";
    vars[0].type = get_int_mir_type (sizeof (mir_size_t));
    vars[1].name = "c";
    vars[1].type = get_int_mir_type (sizeof (mir_int));
    vars[2].name = "n";
    vars[2].type = get_int_mir_type (sizeof (mir_size_t));
    module = curr_func->module;
    memset_proto = MIR_new_proto_arr (ctx, "memset_p", 1, &ret_type, 3, vars);
    memset_item = MIR_new_import (ctx, "memset");
    move_item_to_module_start (module, memset_proto);
    move_item_to_module_start (module, memset_item);
  }
  args[0] = MIR_new_ref_op (ctx, memset_proto);
  args[1] = MIR_new_ref_op (ctx, memset_item);
  args[2] = get_new_temp (c2m_ctx, get_int_mir_type (sizeof (mir_size_t))).mir_op;
  if (disp == 0) {
    treg_op = MIR_new_reg_op (ctx, base);
  } else {
    treg_op = get_new_temp (c2m_ctx, get_int_mir_type (sizeof (mir_size_t))).mir_op;
    emit3 (c2m_ctx, MIR_ADD, treg_op, MIR_new_reg_op (ctx, base), MIR_new_int_op (ctx, disp));
  }
  args[3] = treg_op;
  args[4] = MIR_new_int_op (ctx, 0);
  args[5] = MIR_new_uint_op (ctx, len);
  emit_insn (c2m_ctx, MIR_new_insn_arr (ctx, MIR_CALL, 6 /* args + proto + func + res */, args));
}